

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

int32_t ures_getFunctionalEquivalent_63
                  (char *result,int32_t resultCapacity,char *path,char *resName,char *keyword,
                  char *locid,UBool *isAvailable,UBool omitDefault,UErrorCode *status)

{
  UChar *pUVar1;
  UBool UVar2;
  int iVar3;
  int32_t iVar4;
  char *__src;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  int local_1e1c;
  int32_t copyLength;
  int32_t defLen_2;
  UChar *defUstr_2;
  UChar *pUStack_1e08;
  int32_t defLen_1;
  UChar *defUstr_1;
  UChar *pUStack_1df8;
  int32_t defLen;
  UChar *defUstr;
  UEnumeration *locEnum;
  int32_t length;
  UErrorCode subStatus;
  UResourceBundle *res;
  UResourceBundle bund2;
  UResourceBundle bund1;
  char full [1024];
  char parent [1024];
  char found [1024];
  char base [1024];
  char defLoc [1024];
  char defVal [1024];
  char kwVal [1024];
  char *locid_local;
  char *keyword_local;
  char *resName_local;
  char *path_local;
  int32_t resultCapacity_local;
  char *result_local;
  
  memset(defVal + 0x3f8,0,0x400);
  memset(defLoc + 0x3f8,0,0x400);
  memset(base + 0x3f8,0,0x400);
  memset(found + 0x3f8,0,0x400);
  memset(&bund1.fSize,0,0x400);
  _length = (UResourceBundle *)0x0;
  locEnum._4_4_ = U_ZERO_ERROR;
  locEnum._0_4_ = 0;
  UVar2 = U_FAILURE(*status);
  if (UVar2 == '\0') {
    uloc_getKeywordValue_63(locid,keyword,defVal + 0x3f8,0x3ff,(UErrorCode *)((long)&locEnum + 4));
    iVar3 = strcmp(defVal + 0x3f8,"default");
    if (iVar3 == 0) {
      defVal[0x3f8] = '\0';
    }
    uloc_getBaseName_63(locid,found + 0x3f8,0x3ff,(UErrorCode *)((long)&locEnum + 4));
    ures_initStackObject_63((UResourceBundle *)&bund2.fSize);
    ures_initStackObject_63((UResourceBundle *)&res);
    strcpy(full + 0x3f8,found + 0x3f8);
    strcpy(parent + 0x3f8,found + 0x3f8);
    if (isAvailable != (UBool *)0x0) {
      defUstr = (UChar *)ures_openAvailableLocales_63(path,(UErrorCode *)((long)&locEnum + 4));
      *isAvailable = '\x01';
      UVar2 = U_SUCCESS(locEnum._4_4_);
      if (UVar2 != '\0') {
        UVar2 = isLocaleInList((UEnumeration *)defUstr,full + 0x3f8,
                               (UErrorCode *)((long)&locEnum + 4));
        *isAvailable = UVar2;
      }
      uenum_close_63((UEnumeration *)defUstr);
    }
    UVar2 = U_FAILURE(locEnum._4_4_);
    if (UVar2 == '\0') {
      do {
        locEnum._4_4_ = U_ZERO_ERROR;
        _length = ures_open_63(path,full + 0x3f8,(UErrorCode *)((long)&locEnum + 4));
        if (((locEnum._4_4_ == U_ERROR_WARNING_START) || (locEnum._4_4_ == U_USING_DEFAULT_WARNING))
           && (isAvailable != (UBool *)0x0)) {
          *isAvailable = '\0';
        }
        isAvailable = (UBool *)0x0;
        UVar2 = U_FAILURE(locEnum._4_4_);
        if (UVar2 == '\0') {
          if ((locEnum._4_4_ == U_ZERO_ERROR) &&
             (ures_getByKey_63(_length,resName,(UResourceBundle *)&bund2.fSize,
                               (UErrorCode *)((long)&locEnum + 4)), locEnum._4_4_ == U_ZERO_ERROR))
          {
            pUStack_1df8 = ures_getStringByKey_63
                                     ((UResourceBundle *)&bund2.fSize,"default",
                                      (int32_t *)((long)&defUstr_1 + 4),
                                      (UErrorCode *)((long)&locEnum + 4));
            UVar2 = U_SUCCESS(locEnum._4_4_);
            pUVar1 = pUStack_1df8;
            if ((UVar2 != '\0') && (defUstr_1._4_4_ != 0)) {
              iVar4 = u_strlen_63(pUStack_1df8);
              u_UCharsToChars_63(pUVar1,defLoc + 0x3f8,iVar4);
              strcpy(base + 0x3f8,full + 0x3f8);
              if (defVal[0x3f8] == '\0') {
                strcpy(defVal + 0x3f8,defLoc + 0x3f8);
              }
            }
          }
        }
        else {
          *status = locEnum._4_4_;
        }
        locEnum._4_4_ = 0;
        if (_length != (UResourceBundle *)0x0) {
          __src = ures_getLocaleByType_63
                            (_length,ULOC_VALID_LOCALE,(UErrorCode *)((long)&locEnum + 4));
          strcpy(parent + 0x3f8,__src);
        }
        uloc_getParent_63(parent + 0x3f8,full + 0x3f8,0x400,(UErrorCode *)((long)&locEnum + 4));
        ures_close_63(_length);
        bVar7 = false;
        if ((defLoc[0x3f8] == '\0') && (bVar7 = false, parent[0x3f8] != '\0')) {
          iVar3 = strcmp(parent + 0x3f8,"root");
          bVar7 = false;
          if (iVar3 != 0) {
            UVar2 = U_SUCCESS(*status);
            bVar7 = UVar2 != '\0';
          }
        }
      } while (bVar7);
      strcpy(full + 0x3f8,found + 0x3f8);
      strcpy(parent + 0x3f8,found + 0x3f8);
      do {
        locEnum._4_4_ = U_ZERO_ERROR;
        _length = ures_open_63(path,full + 0x3f8,(UErrorCode *)((long)&locEnum + 4));
        UVar2 = U_FAILURE(locEnum._4_4_);
        if (UVar2 == '\0') {
          if (((locEnum._4_4_ == U_ZERO_ERROR) &&
              (ures_getByKey_63(_length,resName,(UResourceBundle *)&bund2.fSize,
                                (UErrorCode *)((long)&locEnum + 4)), locEnum._4_4_ == U_ZERO_ERROR))
             && (ures_getByKey_63((UResourceBundle *)&bund2.fSize,defVal + 0x3f8,
                                  (UResourceBundle *)&res,(UErrorCode *)((long)&locEnum + 4)),
                locEnum._4_4_ == U_ZERO_ERROR)) {
            strcpy((char *)&bund1.fSize,full + 0x3f8);
            if ((char)bund1.fSize == '\0') {
              strcpy((char *)&bund1.fSize,"root");
            }
            sVar6 = strlen(base + 0x3f8);
            sVar5 = strlen((char *)&bund1.fSize);
            if (sVar5 < sVar6) {
              pUStack_1e08 = ures_getStringByKey_63
                                       ((UResourceBundle *)&bund2.fSize,"default",
                                        (int32_t *)((long)&defUstr_2 + 4),
                                        (UErrorCode *)((long)&locEnum + 4));
              UVar2 = U_SUCCESS(locEnum._4_4_);
              pUVar1 = pUStack_1e08;
              if ((UVar2 != '\0') && (defUstr_2._4_4_ != 0)) {
                iVar4 = u_strlen_63(pUStack_1e08);
                u_UCharsToChars_63(pUVar1,defLoc + 0x3f8,iVar4);
                strcpy(base + 0x3f8,(char *)&bund1.fSize);
              }
            }
          }
        }
        else {
          *status = locEnum._4_4_;
        }
        locEnum._4_4_ = 0;
        strcpy(parent + 0x3f8,full + 0x3f8);
        uloc_getParent_63(parent + 0x3f8,full + 0x3f8,0x3ff,(UErrorCode *)((long)&locEnum + 4));
        ures_close_63(_length);
        bVar7 = false;
        if (((char)bund1.fSize == '\0') && (bVar7 = false, parent[0x3f8] != '\0')) {
          UVar2 = U_SUCCESS(*status);
          bVar7 = UVar2 != '\0';
        }
      } while (bVar7);
      if (((char)bund1.fSize == '\0') && (iVar3 = strcmp(defVal + 0x3f8,defLoc + 0x3f8), iVar3 != 0)
         ) {
        strcpy(defVal + 0x3f8,defLoc + 0x3f8);
        strcpy(full + 0x3f8,found + 0x3f8);
        strcpy(parent + 0x3f8,found + 0x3f8);
        do {
          locEnum._4_4_ = U_ZERO_ERROR;
          _length = ures_open_63(path,full + 0x3f8,(UErrorCode *)((long)&locEnum + 4));
          UVar2 = U_FAILURE(locEnum._4_4_);
          if (UVar2 == '\0') {
            if (((locEnum._4_4_ == U_ZERO_ERROR) &&
                (ures_getByKey_63(_length,resName,(UResourceBundle *)&bund2.fSize,
                                  (UErrorCode *)((long)&locEnum + 4)), locEnum._4_4_ == U_ZERO_ERROR
                )) && (ures_getByKey_63((UResourceBundle *)&bund2.fSize,defVal + 0x3f8,
                                        (UResourceBundle *)&res,(UErrorCode *)((long)&locEnum + 4)),
                      locEnum._4_4_ == U_ZERO_ERROR)) {
              strcpy((char *)&bund1.fSize,full + 0x3f8);
              if ((char)bund1.fSize == '\0') {
                strcpy((char *)&bund1.fSize,"root");
              }
              sVar6 = strlen(base + 0x3f8);
              sVar5 = strlen((char *)&bund1.fSize);
              if (sVar5 < sVar6) {
                _copyLength = ures_getStringByKey_63
                                        ((UResourceBundle *)&bund2.fSize,"default",&local_1e1c,
                                         (UErrorCode *)((long)&locEnum + 4));
                UVar2 = U_SUCCESS(locEnum._4_4_);
                pUVar1 = _copyLength;
                if ((UVar2 != '\0') && (local_1e1c != 0)) {
                  iVar4 = u_strlen_63(_copyLength);
                  u_UCharsToChars_63(pUVar1,defLoc + 0x3f8,iVar4);
                  strcpy(base + 0x3f8,(char *)&bund1.fSize);
                }
              }
            }
          }
          else {
            *status = locEnum._4_4_;
          }
          locEnum._4_4_ = 0;
          strcpy(parent + 0x3f8,full + 0x3f8);
          uloc_getParent_63(parent + 0x3f8,full + 0x3f8,0x3ff,(UErrorCode *)((long)&locEnum + 4));
          ures_close_63(_length);
          bVar7 = false;
          if (((char)bund1.fSize == '\0') && (bVar7 = false, parent[0x3f8] != '\0')) {
            UVar2 = U_SUCCESS(*status);
            bVar7 = UVar2 != '\0';
          }
        } while (bVar7);
      }
      UVar2 = U_SUCCESS(*status);
      if (UVar2 != '\0') {
        if ((char)bund1.fSize == '\0') {
          *status = U_MISSING_RESOURCE_ERROR;
        }
        else if (omitDefault != '\0') {
          sVar6 = strlen(base + 0x3f8);
          sVar5 = strlen((char *)&bund1.fSize);
          if ((sVar6 <= sVar5) && (iVar3 = strcmp(defVal + 0x3f8,defLoc + 0x3f8), iVar3 == 0)) {
            defVal[0x3f8] = '\0';
          }
        }
        strcpy(parent + 0x3f8,(char *)&bund1.fSize);
        if (defVal[0x3f8] == '\0') {
          if (omitDefault == '\0') {
            strcat(parent + 0x3f8,"@");
            strcat(parent + 0x3f8,keyword);
            strcat(parent + 0x3f8,"=");
            strcat(parent + 0x3f8,defLoc + 0x3f8);
          }
        }
        else {
          strcat(parent + 0x3f8,"@");
          strcat(parent + 0x3f8,keyword);
          strcat(parent + 0x3f8,"=");
          strcat(parent + 0x3f8,defVal + 0x3f8);
        }
      }
      ures_close_63((UResourceBundle *)&bund2.fSize);
      ures_close_63((UResourceBundle *)&res);
      sVar6 = strlen(parent + 0x3f8);
      locEnum._0_4_ = (int32_t)sVar6;
      UVar2 = U_SUCCESS(*status);
      if (UVar2 == '\0') {
        locEnum._0_4_ = 0;
        *result = '\0';
      }
      else {
        iVar4 = uprv_min_63((int32_t)locEnum,resultCapacity);
        if (0 < iVar4) {
          strncpy(result,parent + 0x3f8,(long)iVar4);
        }
        if ((int32_t)locEnum == 0) {
          *status = U_MISSING_RESOURCE_ERROR;
        }
      }
      result_local._4_4_ = u_terminateChars_63(result,resultCapacity,(int32_t)locEnum,status);
    }
    else {
      *status = locEnum._4_4_;
      result_local._4_4_ = 0;
    }
  }
  else {
    result_local._4_4_ = 0;
  }
  return result_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ures_getFunctionalEquivalent(char *result, int32_t resultCapacity,
                             const char *path, const char *resName, const char *keyword, const char *locid,
                             UBool *isAvailable, UBool omitDefault, UErrorCode *status)
{
    char kwVal[1024] = ""; /* value of keyword 'keyword' */
    char defVal[1024] = ""; /* default value for given locale */
    char defLoc[1024] = ""; /* default value for given locale */
    char base[1024] = ""; /* base locale */
    char found[1024];
    char parent[1024];
    char full[1024] = "";
    UResourceBundle bund1, bund2;
    UResourceBundle *res = NULL;
    UErrorCode subStatus = U_ZERO_ERROR;
    int32_t length = 0;
    if(U_FAILURE(*status)) return 0;
    uloc_getKeywordValue(locid, keyword, kwVal, 1024-1,&subStatus);
    if(!uprv_strcmp(kwVal, DEFAULT_TAG)) {
        kwVal[0]=0;
    }
    uloc_getBaseName(locid, base, 1024-1,&subStatus);
#if defined(URES_TREE_DEBUG)
    fprintf(stderr, "getFunctionalEquivalent: \"%s\" [%s=%s] in %s - %s\n", 
            locid, keyword, kwVal, base, u_errorName(subStatus));
#endif
    ures_initStackObject(&bund1);
    ures_initStackObject(&bund2);
    
    
    uprv_strcpy(parent, base);
    uprv_strcpy(found, base);

    if(isAvailable) { 
        UEnumeration *locEnum = ures_openAvailableLocales(path, &subStatus);
        *isAvailable = TRUE;
        if (U_SUCCESS(subStatus)) {
            *isAvailable = isLocaleInList(locEnum, parent, &subStatus);
        }
        uenum_close(locEnum);
    }

    if(U_FAILURE(subStatus)) {
        *status = subStatus;
        return 0;
    }
    
    do {
        subStatus = U_ZERO_ERROR;
        res = ures_open(path, parent, &subStatus);
        if(((subStatus == U_USING_FALLBACK_WARNING) ||
            (subStatus == U_USING_DEFAULT_WARNING)) && isAvailable)
        {
            *isAvailable = FALSE;
        }
        isAvailable = NULL; /* only want to set this the first time around */
        
#if defined(URES_TREE_DEBUG)
        fprintf(stderr, "%s;%s -> %s [%s]\n", path?path:"ICUDATA", parent, u_errorName(subStatus), ures_getLocale(res, &subStatus));
#endif
        if(U_FAILURE(subStatus)) {
            *status = subStatus;
        } else if(subStatus == U_ZERO_ERROR) {
            ures_getByKey(res,resName,&bund1, &subStatus);
            if(subStatus == U_ZERO_ERROR) {
                const UChar *defUstr;
                int32_t defLen;
                /* look for default item */
#if defined(URES_TREE_DEBUG)
                fprintf(stderr, "%s;%s : loaded default -> %s\n",
                    path?path:"ICUDATA", parent, u_errorName(subStatus));
#endif
                defUstr = ures_getStringByKey(&bund1, DEFAULT_TAG, &defLen, &subStatus);
                if(U_SUCCESS(subStatus) && defLen) {
                    u_UCharsToChars(defUstr, defVal, u_strlen(defUstr));
#if defined(URES_TREE_DEBUG)
                    fprintf(stderr, "%s;%s -> default %s=%s,  %s\n", 
                        path?path:"ICUDATA", parent, keyword, defVal, u_errorName(subStatus));
#endif
                    uprv_strcpy(defLoc, parent);
                    if(kwVal[0]==0) {
                        uprv_strcpy(kwVal, defVal);
#if defined(URES_TREE_DEBUG)
                        fprintf(stderr, "%s;%s -> kwVal =  %s\n", 
                            path?path:"ICUDATA", parent, keyword, kwVal);
#endif
                    }
                }
            }
        }
        
        subStatus = U_ZERO_ERROR;

        if (res != NULL) {
            uprv_strcpy(found, ures_getLocaleByType(res, ULOC_VALID_LOCALE, &subStatus));
        }

        uloc_getParent(found,parent,sizeof(parent),&subStatus);
        ures_close(res);
    } while(!defVal[0] && *found && uprv_strcmp(found, "root") != 0 && U_SUCCESS(*status));
    
    /* Now, see if we can find the kwVal collator.. start the search over.. */
    uprv_strcpy(parent, base);
    uprv_strcpy(found, base);
    
    do {
        subStatus = U_ZERO_ERROR;
        res = ures_open(path, parent, &subStatus);
        if((subStatus == U_USING_FALLBACK_WARNING) && isAvailable) {
            *isAvailable = FALSE;
        }
        isAvailable = NULL; /* only want to set this the first time around */
        
#if defined(URES_TREE_DEBUG)
        fprintf(stderr, "%s;%s -> %s (looking for %s)\n", 
            path?path:"ICUDATA", parent, u_errorName(subStatus), kwVal);
#endif
        if(U_FAILURE(subStatus)) {
            *status = subStatus;
        } else if(subStatus == U_ZERO_ERROR) {
            ures_getByKey(res,resName,&bund1, &subStatus);
#if defined(URES_TREE_DEBUG)
/**/ fprintf(stderr,"@%d [%s] %s\n", __LINE__, resName, u_errorName(subStatus));
#endif
            if(subStatus == U_ZERO_ERROR) {
                ures_getByKey(&bund1, kwVal, &bund2, &subStatus);
#if defined(URES_TREE_DEBUG)
/**/ fprintf(stderr,"@%d [%s] %s\n", __LINE__, kwVal, u_errorName(subStatus));
#endif
                if(subStatus == U_ZERO_ERROR) {
#if defined(URES_TREE_DEBUG)
                    fprintf(stderr, "%s;%s -> full0 %s=%s,  %s\n", 
                        path?path:"ICUDATA", parent, keyword, kwVal, u_errorName(subStatus));
#endif
                    uprv_strcpy(full, parent);
                    if(*full == 0) {
                        uprv_strcpy(full, "root");
                    }
                        /* now, recalculate default kw if need be */
                        if(uprv_strlen(defLoc) > uprv_strlen(full)) {
                          const UChar *defUstr;
                          int32_t defLen;
                          /* look for default item */
#if defined(URES_TREE_DEBUG)
                            fprintf(stderr, "%s;%s -> recalculating Default0\n", 
                                    path?path:"ICUDATA", full);
#endif
                          defUstr = ures_getStringByKey(&bund1, DEFAULT_TAG, &defLen, &subStatus);
                          if(U_SUCCESS(subStatus) && defLen) {
                            u_UCharsToChars(defUstr, defVal, u_strlen(defUstr));
#if defined(URES_TREE_DEBUG)
                            fprintf(stderr, "%s;%s -> default0 %s=%s,  %s\n", 
                                    path?path:"ICUDATA", full, keyword, defVal, u_errorName(subStatus));
#endif
                            uprv_strcpy(defLoc, full);
                          }
                        } /* end of recalculate default KW */
#if defined(URES_TREE_DEBUG)
                        else {
                          fprintf(stderr, "No trim0,  %s <= %s\n", defLoc, full);
                        }
#endif
                } else {
#if defined(URES_TREE_DEBUG)
                    fprintf(stderr, "err=%s in %s looking for %s\n", 
                        u_errorName(subStatus), parent, kwVal);
#endif
                }
            }
        }
        
        subStatus = U_ZERO_ERROR;
        
        uprv_strcpy(found, parent);
        uloc_getParent(found,parent,1023,&subStatus);
        ures_close(res);
    } while(!full[0] && *found && U_SUCCESS(*status));
    
    if((full[0]==0) && uprv_strcmp(kwVal, defVal)) {
#if defined(URES_TREE_DEBUG)
        fprintf(stderr, "Failed to locate kw %s - try default %s\n", kwVal, defVal);
#endif
        uprv_strcpy(kwVal, defVal);
        uprv_strcpy(parent, base);
        uprv_strcpy(found, base);
        
        do { /* search for 'default' named item */
            subStatus = U_ZERO_ERROR;
            res = ures_open(path, parent, &subStatus);
            if((subStatus == U_USING_FALLBACK_WARNING) && isAvailable) {
                *isAvailable = FALSE;
            }
            isAvailable = NULL; /* only want to set this the first time around */
            
#if defined(URES_TREE_DEBUG)
            fprintf(stderr, "%s;%s -> %s (looking for default %s)\n",
                path?path:"ICUDATA", parent, u_errorName(subStatus), kwVal);
#endif
            if(U_FAILURE(subStatus)) {
                *status = subStatus;
            } else if(subStatus == U_ZERO_ERROR) {
                ures_getByKey(res,resName,&bund1, &subStatus);
                if(subStatus == U_ZERO_ERROR) {
                    ures_getByKey(&bund1, kwVal, &bund2, &subStatus);
                    if(subStatus == U_ZERO_ERROR) {
#if defined(URES_TREE_DEBUG)
                        fprintf(stderr, "%s;%s -> full1 %s=%s,  %s\n", path?path:"ICUDATA",
                            parent, keyword, kwVal, u_errorName(subStatus));
#endif
                        uprv_strcpy(full, parent);
                        if(*full == 0) {
                            uprv_strcpy(full, "root");
                        }
                        
                        /* now, recalculate default kw if need be */
                        if(uprv_strlen(defLoc) > uprv_strlen(full)) {
                          const UChar *defUstr;
                          int32_t defLen;
                          /* look for default item */
#if defined(URES_TREE_DEBUG)
                            fprintf(stderr, "%s;%s -> recalculating Default1\n", 
                                    path?path:"ICUDATA", full);
#endif
                          defUstr = ures_getStringByKey(&bund1, DEFAULT_TAG, &defLen, &subStatus);
                          if(U_SUCCESS(subStatus) && defLen) {
                            u_UCharsToChars(defUstr, defVal, u_strlen(defUstr));
#if defined(URES_TREE_DEBUG)
                            fprintf(stderr, "%s;%s -> default %s=%s,  %s\n", 
                                    path?path:"ICUDATA", full, keyword, defVal, u_errorName(subStatus));
#endif
                            uprv_strcpy(defLoc, full);
                          }
                        } /* end of recalculate default KW */
#if defined(URES_TREE_DEBUG)
                        else {
                          fprintf(stderr, "No trim1,  %s <= %s\n", defLoc, full);
                        }
#endif
                    }
                }
            }
            subStatus = U_ZERO_ERROR;
            
            uprv_strcpy(found, parent);
            uloc_getParent(found,parent,1023,&subStatus);
            ures_close(res);
        } while(!full[0] && *found && U_SUCCESS(*status));
    }
    
    if(U_SUCCESS(*status)) {
        if(!full[0]) {
#if defined(URES_TREE_DEBUG)
          fprintf(stderr, "Still could not load keyword %s=%s\n", keyword, kwVal);
#endif
          *status = U_MISSING_RESOURCE_ERROR;
        } else if(omitDefault) {
#if defined(URES_TREE_DEBUG)
          fprintf(stderr,"Trim? full=%s, defLoc=%s, found=%s\n", full, defLoc, found);
#endif        
          if(uprv_strlen(defLoc) <= uprv_strlen(full)) {
            /* found the keyword in a *child* of where the default tag was present. */
            if(!uprv_strcmp(kwVal, defVal)) { /* if the requested kw is default, */
              /* and the default is in or in an ancestor of the current locale */
#if defined(URES_TREE_DEBUG)
              fprintf(stderr, "Removing unneeded var %s=%s\n", keyword, kwVal);
#endif
              kwVal[0]=0;
            }
          }
        }
        uprv_strcpy(found, full);
        if(kwVal[0]) {
            uprv_strcat(found, "@");
            uprv_strcat(found, keyword);
            uprv_strcat(found, "=");
            uprv_strcat(found, kwVal);
        } else if(!omitDefault) {
            uprv_strcat(found, "@");
            uprv_strcat(found, keyword);
            uprv_strcat(found, "=");
            uprv_strcat(found, defVal);
        }
    }
    /* we found the default locale - no need to repeat it.*/
    
    ures_close(&bund1);
    ures_close(&bund2);
    
    length = (int32_t)uprv_strlen(found);

    if(U_SUCCESS(*status)) {
        int32_t copyLength = uprv_min(length, resultCapacity);
        if(copyLength>0) {
            uprv_strncpy(result, found, copyLength);
        }
        if(length == 0) {
          *status = U_MISSING_RESOURCE_ERROR; 
        }
    } else {
        length = 0;
        result[0]=0;
    }
    return u_terminateChars(result, resultCapacity, length, status);
}